

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfCsvParser.c
# Opt level: O1

sbfError sbfCsvParser_next(FILE *f,char ***fields,u_int *nfields,u_char separator,u_int *line)

{
  char cVar1;
  char cVar2;
  u_int uVar3;
  sbfError sVar4;
  size_t sVar5;
  u_int *puVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  void *__ptr;
  char **ppcVar10;
  int *piVar11;
  undefined7 in_register_00000009;
  char *pcVar12;
  size_t sVar13;
  uint uVar14;
  size_t sVar15;
  size_t sVar16;
  bool bVar17;
  size_t len;
  size_t local_48;
  u_int *local_40;
  uint local_38;
  uint local_34;
  
  local_34 = (uint)CONCAT71(in_register_00000009,separator);
  do {
    pcVar8 = fgetln(f,&local_48);
    if (pcVar8 == (char *)0x0) {
      piVar11 = __errno_location();
      sVar4 = *piVar11;
      iVar7 = feof((FILE *)f);
      if (iVar7 != 0) {
        return 2;
      }
      return sVar4;
    }
    if (line != (u_int *)0x0) {
      *line = *line + 1;
    }
    bVar17 = local_48 == 0;
    pcVar12 = pcVar8;
    if (!bVar17) {
      pcVar12 = pcVar8 + local_48;
      do {
        sVar9 = local_48 - 1;
        if ((*pcVar8 != ' ') && (*pcVar8 != '\t')) {
          pcVar12 = pcVar8;
          if ((!bVar17) && (pcVar8[sVar9] == '\n')) {
            local_48 = sVar9;
          }
          break;
        }
        pcVar8 = pcVar8 + 1;
        bVar17 = local_48 == 1;
        local_48 = sVar9;
      } while (sVar9 != 0);
    }
  } while (local_48 == 0);
  *fields = (char **)0x0;
  *nfields = 0;
  sVar9 = 0;
  uVar14 = local_34 & 0xff;
LAB_00104ef2:
  do {
    if (sVar9 == local_48) {
LAB_001050da:
      pcVar8 = sbfMemory_strdup("");
      uVar3 = *nfields;
      *nfields = uVar3 + 1;
      ppcVar10 = (char **)sbfMemory_realloc(*fields,(ulong)(uVar3 + 1),8);
      *fields = ppcVar10;
      ppcVar10[*nfields - 1] = pcVar8;
      return 0;
    }
    if ((pcVar12[sVar9] != ' ') && (pcVar12[sVar9] != '\t')) {
      if (sVar9 == local_48) goto LAB_001050da;
      cVar1 = pcVar12[sVar9];
      sVar9 = (cVar1 == '\"') + sVar9;
      bVar17 = true;
      local_38 = uVar14;
      if (sVar9 == local_48) {
        __ptr = (void *)0x0;
        sVar16 = 0;
      }
      else {
        __ptr = (void *)0x0;
        sVar13 = sVar9;
        sVar15 = 0;
        local_40 = nfields;
        do {
          puVar6 = local_40;
          sVar9 = sVar13 + 1;
          cVar2 = pcVar12[sVar13];
          nfields = local_40;
          sVar16 = sVar15;
          if ((cVar1 != '\"') && (cVar2 == (char)local_34)) {
            if (sVar15 != 0) goto LAB_00104fc7;
            bVar17 = false;
            break;
          }
          if ((cVar1 == '\"') && (cVar2 == '\"')) {
            if (sVar9 == local_48) break;
            sVar5 = sVar9;
            if (pcVar12[sVar9] != '\"') goto joined_r0x00104fef;
            sVar9 = sVar13 + 2;
          }
          sVar16 = sVar15 + 1;
          __ptr = sbfMemory_realloc(__ptr,sVar16,1);
          *(char *)((long)__ptr + sVar15) = cVar2;
          nfields = local_40;
          sVar13 = sVar9;
          sVar15 = sVar16;
        } while (sVar9 != local_48);
      }
      goto LAB_00105015;
    }
    sVar9 = sVar9 + 1;
  } while( true );
  while (sVar15 = sVar15 - 1, sVar15 != 0) {
LAB_00104fc7:
    if (*(char *)((long)__ptr + (sVar15 - 1)) != ' ') {
      bVar17 = false;
      sVar16 = sVar15;
      goto LAB_00105015;
    }
  }
  bVar17 = false;
  sVar16 = 0;
LAB_00105015:
  pcVar8 = (char *)sbfMemory_realloc(__ptr,sVar16 + 1,1);
  pcVar8[sVar16] = '\0';
  uVar3 = *nfields;
  *nfields = uVar3 + 1;
  ppcVar10 = (char **)sbfMemory_realloc(*fields,(ulong)(uVar3 + 1),8);
  *fields = ppcVar10;
  ppcVar10[*nfields - 1] = pcVar8;
  uVar14 = local_38;
  if (bVar17) {
    return 0;
  }
  goto LAB_00104ef2;
joined_r0x00104fef:
  if (sVar5 == local_48) goto LAB_001050ad;
  if ((pcVar12[sVar5] != ' ') && (pcVar12[sVar5] != '\t')) {
    sVar9 = sVar5;
    if (sVar5 != local_48) {
      if ((int)pcVar12[sVar5] != local_38) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        sbfCsvParser_free(*fields,*puVar6);
        return 0x16;
      }
      sVar9 = sVar5 + 1;
    }
    goto LAB_001050ad;
  }
  sVar5 = sVar5 + 1;
  sVar9 = local_48;
  goto joined_r0x00104fef;
LAB_001050ad:
  bVar17 = sVar9 == local_48;
  goto LAB_00105015;
}

Assistant:

sbfError
sbfCsvParser_next (FILE* f,
                   char*** fields,
                   u_int* nfields,
                   u_char separator,
                   u_int* line)
{
    char*  buf;
    size_t len;
    size_t off;
    u_char c;
    char*  next;
    size_t nextlen;
    int    quoted;
    int    done;
    int    comma;
    int    saved_errno;

    do
    {
        buf = fgetln (f, &len);
        if (buf == NULL)
        {
            saved_errno = errno;
            if (feof (f))
                return ENOENT;
           return saved_errno;
        }
        if (line != NULL)
            (*line)++;
        while (len > 0 && (*buf == ' ' || *buf == '\t'))
        {
            buf++;
            len--;
        }
        if (len > 0 && buf[len - 1] == '\n')
            len--;
    }
    while (len == 0);

    *fields = NULL;
    *nfields = 0;

    off = 0;
    for (;;)
    {
        next = NULL;
        nextlen = 0;

        while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
            off++;
        if (off == len)
        {
            sbfCsvParserAdd (fields, nfields, xstrdup (""));
            break;
        }

        quoted = buf[off] == '"';
        if (quoted)
            off++;

        comma = done = 0;
        while (off != len)
        {
            c = buf[off++];

            if (!quoted && c == separator)
            {
                while (nextlen > 0 && next[nextlen - 1] == ' ')
                    nextlen--;
                comma = 1;
                break;
            }
            if (quoted && c == '"')
            {
                if (off == len)
                    break;
                if (buf[off] != '"')
                {
                    while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
                        off++;
                    if (off != len && buf[off++] != separator)
                        goto fail;
                    if (off != len)
                        comma = 1;
                    break;
                }
                else
                    off++;
            }

            sbfCsvParserExpand (&next, &nextlen, 1);
            next[nextlen - 1] = c;
        }

        sbfCsvParserExpand (&next, &nextlen, 1);
        next[nextlen - 1] = '\0';
        sbfCsvParserAdd (fields, nfields, next);

        if (!comma)
            break;
    }

    return 0;

fail:
    if (next != NULL)
        free (next);
    sbfCsvParser_free (*fields, *nfields);
    return EINVAL;
}